

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

RegSlot __thiscall IRBuilder::InnerScopeIndexToRegSlot(IRBuilder *this,uint32 index)

{
  uint uVar1;
  RegSlot RVar2;
  RegSlot RVar3;
  JITTimeFunctionBody *pJVar4;
  RegSlot reg;
  uint32 index_local;
  IRBuilder *this_local;
  
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  uVar1 = JITTimeFunctionBody::GetInnerScopeCount(pJVar4);
  if (uVar1 <= index) {
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  RVar2 = JITTimeFunctionBody::GetFirstInnerScopeReg(pJVar4);
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetLocalsCount(pJVar4);
  if (RVar3 <= RVar2 + index) {
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  return RVar2 + index;
}

Assistant:

Js::RegSlot
IRBuilder::InnerScopeIndexToRegSlot(uint32 index) const
{
    if (index >= m_func->GetJITFunctionBody()->GetInnerScopeCount())
    {
        Js::Throw::FatalInternalError();
    }
    Js::RegSlot reg = m_func->GetJITFunctionBody()->GetFirstInnerScopeReg() + index;
    if (reg >= m_func->GetJITFunctionBody()->GetLocalsCount())
    {
        Js::Throw::FatalInternalError();
    }
    return reg;
}